

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O3

AggregateFunctionSet * duckdb::BitXorFun::GetFunctions(void)

{
  AggregateFunction *this;
  InternalException *this_00;
  LogicalType *in_RCX;
  AggregateFunctionSet *in_RDI;
  FunctionNullHandling in_R8B;
  LogicalType *other;
  string local_318;
  vector<duckdb::AggregateFunction,_true> *local_2f8;
  LogicalType *local_2f0;
  LogicalType *local_2e8;
  LogicalType local_2d8;
  undefined1 local_2c0 [48];
  AggregateFunction local_290;
  AggregateFunction local_160;
  
  AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  LogicalType::Integral();
  if (local_2f0 != local_2e8) {
    local_2f8 = &(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions;
    this = (AggregateFunction *)(local_2c0 + 0x18);
    other = local_2f0;
    do {
      LogicalType::LogicalType((LogicalType *)this,other);
      if ((byte)local_2c0[0x18] < 0x1c) {
        switch(local_2c0[0x18]) {
        case 0xb:
          LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_char>,signed_char,signed_char,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
          break;
        case 0xc:
          LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_short>,short,short,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
          break;
        case 0xd:
          LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_int>,int,int,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
          break;
        case 0xe:
          LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_long>,long,long,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
          break;
        default:
switchD_00d24070_default:
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,"Unimplemented bitfield type for unary aggregate","");
          InternalException::InternalException(this_00,&local_318);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        switch(local_2c0[0x18]) {
        case 0x1c:
          LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_char>,unsigned_char,unsigned_char,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
          break;
        case 0x1d:
          LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_short>,unsigned_short,unsigned_short,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
          break;
        case 0x1e:
          LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_int>,unsigned_int,unsigned_int,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
          break;
        case 0x1f:
          LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
          in_RCX = (LogicalType *)0x0;
          AggregateFunction::
          UnaryAggregate<duckdb::BitState<unsigned_long>,unsigned_long,unsigned_long,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                    (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
          break;
        default:
          if (local_2c0[0x18] == 0x31) {
            LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
            in_RCX = (LogicalType *)0x0;
            AggregateFunction::
            UnaryAggregate<duckdb::BitState<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                      (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
          }
          else {
            if (local_2c0[0x18] != 0x32) goto switchD_00d24070_default;
            LogicalType::LogicalType((LogicalType *)&local_318,(LogicalType *)this);
            in_RCX = (LogicalType *)0x0;
            AggregateFunction::
            UnaryAggregate<duckdb::BitState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BitXorOperation,(duckdb::AggregateDestructorType)0>
                      (&local_160,this,(LogicalType *)&local_318,(LogicalType *)0x0,in_R8B);
          }
        }
      }
      LogicalType::~LogicalType((LogicalType *)&local_318);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
      emplace_back<duckdb::AggregateFunction>
                (&local_2f8->
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_160);
      local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           (_func_int **)&PTR__AggregateFunction_01966bf8;
      if (local_160.function_info.internal.
          super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_160.function_info.internal.
                   super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      BaseScalarFunction::~BaseScalarFunction(&local_160.super_BaseScalarFunction);
      LogicalType::~LogicalType((LogicalType *)this);
      other = other + 1;
    } while (other != local_2e8);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2f0);
  LogicalType::LogicalType((LogicalType *)local_2c0,BIT);
  LogicalType::LogicalType(&local_2d8,BIT);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::BitState<duckdb::string_t>,duckdb::string_t,duckdb::string_t,duckdb::BitStringXorOperation,(duckdb::AggregateDestructorType)0>
            (&local_290,(AggregateFunction *)local_2c0,&local_2d8,in_RCX);
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&(in_RDI->super_FunctionSet<duckdb::AggregateFunction>).functions.
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_290);
  local_290.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_01966bf8;
  if (local_290.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_290.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_2d8);
  LogicalType::~LogicalType((LogicalType *)local_2c0);
  return in_RDI;
}

Assistant:

AggregateFunctionSet BitXorFun::GetFunctions() {
	AggregateFunctionSet bit_xor;
	for (auto &type : LogicalType::Integral()) {
		bit_xor.AddFunction(GetBitfieldUnaryAggregate<BitXorOperation>(type));
	}
	bit_xor.AddFunction(
	    AggregateFunction::UnaryAggregateDestructor<BitState<string_t>, string_t, string_t, BitStringXorOperation>(
	        LogicalType::BIT, LogicalType::BIT));
	return bit_xor;
}